

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O3

bool __thiscall
double_conversion::DoubleToStringConverter::HandleSpecialValues
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder)

{
  int iVar1;
  char *s;
  
  if (ABS(value) == INFINITY) {
    s = this->infinity_symbol_;
    if (s == (char *)0x0) {
      return false;
    }
    if (value < 0.0) {
      iVar1 = *(int *)(result_builder + 0x10);
      *(int *)(result_builder + 0x10) = iVar1 + 1;
      *(undefined1 *)(*(long *)result_builder + (long)iVar1) = 0x2d;
      s = this->infinity_symbol_;
    }
  }
  else {
    if (((ulong)value & 0xfffffffffffff) == 0 || (~(ulong)value & 0x7ff0000000000000) != 0) {
      return false;
    }
    s = this->nan_symbol_;
    if (s == (char *)0x0) {
      return false;
    }
  }
  StringBuilder::AddString(result_builder,s);
  return true;
}

Assistant:

bool DoubleToStringConverter::HandleSpecialValues(
    double value,
    StringBuilder* result_builder) const {
  Double double_inspect(value);
  if (double_inspect.IsInfinite()) {
    if (infinity_symbol_ == DOUBLE_CONVERSION_NULLPTR) return false;
    if (value < 0) {
      result_builder->AddCharacter('-');
    }
    result_builder->AddString(infinity_symbol_);
    return true;
  }
  if (double_inspect.IsNan()) {
    if (nan_symbol_ == DOUBLE_CONVERSION_NULLPTR) return false;
    result_builder->AddString(nan_symbol_);
    return true;
  }
  return false;
}